

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs)

{
  uint uVar1;
  pointer pMVar2;
  size_t _elemsize;
  Mat *pMVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  size_t b;
  ulong uVar12;
  size_t b_1;
  long lVar13;
  size_t b_3;
  void *pvVar14;
  bool bVar15;
  int local_a0;
  Mat local_60;
  
  pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = pMVar2->dims;
  _elemsize = pMVar2->elemsize;
  if (uVar4 == 1) {
    lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar2) / 0x30;
    piVar11 = &pMVar2->w;
    iVar9 = 0;
    while (bVar15 = lVar6 != 0, lVar6 = lVar6 + -1, bVar15) {
      iVar9 = iVar9 + *piVar11;
      piVar11 = piVar11 + 0xc;
    }
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,iVar9,_elemsize);
    pvVar14 = pMVar3->data;
    local_a0 = -100;
    if ((pvVar14 != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
      local_a0 = 0;
      lVar6 = 0;
      for (uVar12 = 0;
          pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar12 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar2) / 0x30);
          uVar12 = uVar12 + 1) {
        lVar13 = (long)*(int *)((long)&pMVar2->w + lVar6);
        memcpy(pvVar14,*(void **)((long)&pMVar2->data + lVar6),_elemsize * lVar13);
        pvVar14 = (void *)((long)pvVar14 + lVar13 * 4);
        lVar6 = lVar6 + 0x30;
      }
    }
  }
  else {
    uVar1 = this->axis;
    if ((uVar4 ^ 2) == 0 && uVar1 == 0) {
      iVar9 = pMVar2->w;
      lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x30;
      piVar11 = &pMVar2->h;
      iVar7 = 0;
      while (bVar15 = lVar6 != 0, lVar6 = lVar6 + -1, bVar15) {
        iVar7 = iVar7 + *piVar11;
        piVar11 = piVar11 + 0xc;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar9,iVar7,_elemsize);
      pvVar14 = pMVar3->data;
      local_a0 = -100;
      if ((pvVar14 != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
        lVar6 = 0x20;
        local_a0 = 0;
        for (uVar12 = 0;
            pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar12 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x30
                            ); uVar12 = uVar12 + 1) {
          lVar13 = (long)*(int *)((long)&pMVar2->data + lVar6) * (long)iVar9;
          memcpy(pvVar14,*(void **)((long)pMVar2 + lVar6 + -0x20),_elemsize * lVar13);
          pvVar14 = (void *)((long)pvVar14 + lVar13 * 4);
          lVar6 = lVar6 + 0x30;
        }
      }
    }
    else if ((uVar4 ^ 2) == 0 && (uVar1 ^ 1) == 0) {
      iVar9 = pMVar2->h;
      lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x30;
      piVar11 = &pMVar2->w;
      iVar7 = 0;
      while (bVar15 = lVar6 != 0, lVar6 = lVar6 + -1, bVar15) {
        iVar7 = iVar7 + *piVar11;
        piVar11 = piVar11 + 0xc;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar7,iVar9,_elemsize);
      local_a0 = -100;
      if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
        local_a0 = 0;
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        for (iVar7 = 0; iVar7 != iVar9; iVar7 = iVar7 + 1) {
          pvVar14 = (void *)((long)pMVar3->w * (long)iVar7 * 4 + (long)pMVar3->data);
          lVar6 = 0x1c;
          for (uVar12 = 0;
              pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
              uVar12 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) /
                              0x30); uVar12 = uVar12 + 1) {
            lVar13 = (long)*(int *)((long)&pMVar2->data + lVar6);
            memcpy(pvVar14,(void *)(lVar13 * iVar7 * 4 + *(long *)((long)pMVar2 + lVar6 + -0x1c)),
                   lVar13 * _elemsize);
            pvVar14 = (void *)((long)pvVar14 + (long)*(int *)((long)&pMVar2->data + lVar6) * 4);
            lVar6 = lVar6 + 0x30;
          }
        }
      }
    }
    else {
      uVar4 = uVar4 ^ 3;
      if (uVar4 == 0 && uVar1 == 0) {
        lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x30;
        piVar11 = &pMVar2->c;
        iVar9 = 0;
        while (bVar15 = lVar6 != 0, lVar6 = lVar6 + -1, bVar15) {
          iVar9 = iVar9 + *piVar11;
          piVar11 = piVar11 + 0xc;
        }
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar3,pMVar2->w,pMVar2->h,iVar9,_elemsize);
        local_a0 = -100;
        if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
          local_a0 = 0;
          lVar6 = 0x28;
          uVar12 = 0;
          iVar9 = 0;
          while( true ) {
            pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar2) / 0x30) <= uVar12)
            break;
            iVar7 = *(int *)((long)pMVar2 + lVar6 + -4);
            iVar10 = *(int *)((long)&pMVar2->data + lVar6);
            pvVar14 = *(void **)((long)pMVar2 + lVar6 + -0x28);
            Mat::channel(&local_60,pMVar3,iVar9);
            pvVar8 = local_60.data;
            Mat::~Mat(&local_60);
            memcpy(pvVar8,pvVar14,(long)(iVar10 * iVar7) * _elemsize);
            iVar9 = iVar9 + iVar7;
            uVar12 = uVar12 + 1;
            lVar6 = lVar6 + 0x30;
          }
        }
      }
      else if ((uVar1 ^ 1) == 0 && uVar4 == 0) {
        iVar9 = pMVar2->c;
        lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x30;
        piVar11 = &pMVar2->h;
        iVar7 = 0;
        while (bVar15 = lVar6 != 0, lVar6 = lVar6 + -1, bVar15) {
          iVar7 = iVar7 + *piVar11;
          piVar11 = piVar11 + 0xc;
        }
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar3,pMVar2->w,iVar7,iVar9,_elemsize);
        local_a0 = -100;
        if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
          local_a0 = 0;
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          for (iVar7 = 0; iVar7 != iVar9; iVar7 = iVar7 + 1) {
            Mat::channel(&local_60,pMVar3,iVar7);
            pvVar14 = local_60.data;
            Mat::~Mat(&local_60);
            lVar6 = 0;
            uVar12 = 0;
            while( true ) {
              pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if ((ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar2) / 0x30) <= uVar12
                 ) break;
              lVar13 = (long)*(int *)((long)&pMVar2->h + lVar6) *
                       (long)*(int *)((long)&pMVar2->w + lVar6);
              Mat::channel(&local_60,(Mat *)((long)&pMVar2->data + lVar6),iVar7);
              pvVar8 = local_60.data;
              Mat::~Mat(&local_60);
              memcpy(pvVar14,pvVar8,_elemsize * lVar13);
              pvVar14 = (void *)((long)pvVar14 + lVar13 * 4);
              uVar12 = uVar12 + 1;
              lVar6 = lVar6 + 0x30;
            }
          }
        }
      }
      else {
        local_a0 = 0;
        if (uVar4 == 0 && uVar1 == 2) {
          iVar9 = pMVar2->h;
          iVar7 = pMVar2->c;
          lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x30;
          piVar11 = &pMVar2->w;
          iVar10 = 0;
          while (bVar15 = lVar6 != 0, lVar6 = lVar6 + -1, bVar15) {
            iVar10 = iVar10 + *piVar11;
            piVar11 = piVar11 + 0xc;
          }
          pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          Mat::create(pMVar3,iVar10,iVar9,iVar7,_elemsize);
          local_a0 = -100;
          if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
            if (iVar9 < 1) {
              iVar9 = 0;
            }
            local_a0 = 0;
            if (iVar7 < 1) {
              iVar7 = 0;
            }
            for (iVar10 = 0; iVar10 != iVar7; iVar10 = iVar10 + 1) {
              Mat::channel(&local_60,pMVar3,iVar10);
              pvVar14 = local_60.data;
              Mat::~Mat(&local_60);
              for (iVar5 = 0; iVar5 != iVar9; iVar5 = iVar5 + 1) {
                lVar6 = 0;
                uVar12 = 0;
                while( true ) {
                  pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)(((long)(bottom_blobs->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) /
                             0x30) <= uVar12) break;
                  Mat::channel(&local_60,(Mat *)((long)&pMVar2->data + lVar6),iVar10);
                  pvVar8 = (void *)((long)local_60.w * (long)iVar5 * 4 + (long)local_60.data);
                  Mat::~Mat(&local_60);
                  memcpy(pvVar14,pvVar8,(long)*(int *)((long)&pMVar2->w + lVar6) * _elemsize);
                  pvVar14 = (void *)((long)pvVar14 + (long)*(int *)((long)&pMVar2->w + lVar6) * 4);
                  uVar12 = uVar12 + 1;
                  lVar6 = lVar6 + 0x30;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_a0;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;

    if (dims == 1) // axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int i=0; i<h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            int size = bottom_blob.cstep * channels;

            const float* ptr = bottom_blob;
            float* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total height
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                for (size_t b=0; b<bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w;
                }
            }
        }

        return 0;
    }

    return 0;
}